

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O0

void __thiscall cppcms::widgets::checkbox::load(checkbox *this,context *context)

{
  bool bVar1;
  __type _Var2;
  form_type *this_00;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __rhs;
  base_widget *in_RDI;
  pair<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  pVar3;
  pair<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  range;
  base_widget *in_stack_ffffffffffffff90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  string local_40 [8];
  request *in_stack_ffffffffffffffc8;
  _Self local_20;
  _Self local_18 [3];
  
  base_widget::pre_load(in_stack_ffffffffffffff90,(context *)in_RDI);
  base_widget::set((base_widget *)
                   ((long)&(((enable_shared_from_this<cppcms::http::context> *)
                            &in_RDI->super_base_form)->_M_weak_this).
                           super___weak_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr +
                   (long)(((enable_shared_from_this<cppcms::http::context> *)
                          &in_RDI->super_base_form)->_M_weak_this).
                         super___weak_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                         [-1].d.ptr_),true);
  http::context::request((context *)0x3fa4fd);
  this_00 = http::request::post_or_get_abi_cxx11_(in_stack_ffffffffffffffc8);
  base_widget::name_abi_cxx11_(in_RDI);
  pVar3 = std::
          multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::equal_range(this_00,(key_type *)in_RDI);
  local_18[0]._M_node = (_Base_ptr)pVar3.second._M_node;
  __rhs = pVar3.first._M_node;
  local_20._M_node = __rhs._M_node;
  std::__cxx11::string::~string(local_40);
  value((checkbox *)in_RDI,false);
  while( true ) {
    bVar1 = std::operator!=(&local_20,local_18);
    if (!bVar1) {
      return;
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x3fa58e);
    _Var2 = std::operator==(in_stack_ffffffffffffffb0,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            __rhs._M_node);
    if (_Var2) break;
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)this_00);
  }
  value((checkbox *)in_RDI,true);
  return;
}

Assistant:

void checkbox::load(http::context &context)
{
	pre_load(context);
	set(true);
	std::pair<http::request::form_type::const_iterator,http::request::form_type::const_iterator> 
		range=context.request().post_or_get().equal_range(name());
	value(false);
	while(range.first != range.second) {
		if(range.first->second == identification_) {
			value(true);
			break;
		}
		++range.first;
	}
}